

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

void checksum_final(chksumwork_conflict *sumwrk,chksumval_conflict *sumval)

{
  sumalg sVar1;
  _func_int_archive_md5_ctx_ptr_void_ptr **pp_Var2;
  size_t sVar3;
  long lStack_20;
  
  sVar1 = sumwrk->alg;
  sVar3 = (size_t)sVar1;
  if (sVar3 != 0) {
    if (sVar1 == CKSUM_SHA1) {
      pp_Var2 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
      sVar3 = 0x14;
      lStack_20 = 0x10;
    }
    else {
      if (sVar1 != CKSUM_MD5) goto LAB_00273e1c;
      pp_Var2 = &__archive_digest.md5final;
      sVar3 = 0x10;
      lStack_20 = 8;
    }
    (**pp_Var2)((archive_md5_ctx *)((long)&sumwrk->alg + lStack_20),sumval->val);
  }
  sumval->len = sVar3;
LAB_00273e1c:
  sumval->alg = sumwrk->alg;
  return;
}

Assistant:

static int
checksum_final(struct archive_read *a, const void *a_sum_val,
    size_t a_sum_len, const void *e_sum_val, size_t e_sum_len)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)(a->format->data);
	r = _checksum_final(&(xar->a_sumwrk), a_sum_val, a_sum_len);
	if (r == ARCHIVE_OK)
		r = _checksum_final(&(xar->e_sumwrk), e_sum_val, e_sum_len);
	if (r != ARCHIVE_OK)
		archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
		    "Sumcheck error");
	return (r);
}